

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hh
# Opt level: O0

void __thiscall JSON::JSON_string::~JSON_string(JSON_string *this)

{
  JSON_string *this_local;
  
  (this->super_JSON_value)._vptr_JSON_value = (_func_int **)&PTR__JSON_string_0058ac68;
  std::__cxx11::string::~string((string *)&this->utf8);
  JSON_value::~JSON_value(&this->super_JSON_value);
  return;
}

Assistant:

~JSON_string() override = default;